

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_baseline_tree_index_impl.h
# Opt level: O3

double __thiscall
ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
ted_k(TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      *this,TreeIndexAll *t1,TreeIndexAll *t2,int k)

{
  uint uVar1;
  uint t1_size;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  size_t row;
  int iVar8;
  ulong row_00;
  double dVar9;
  double extraout_XMM0_Qa;
  uint local_5c;
  long local_58;
  
  t1_size = (t1->super_Constants).tree_size_;
  iVar5 = (t2->super_Constants).tree_size_;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
  init_matrices(&this->
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ,t1_size,k);
  (this->
  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>).
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
  subproblem_counter_ = 0;
  iVar3 = t1_size - iVar5;
  iVar8 = -iVar3;
  if (0 < iVar3) {
    iVar8 = iVar3;
  }
  if (k < iVar8) {
    dVar9 = INFINITY;
  }
  else {
    if (0 < (int)t1_size) {
      uVar1 = iVar5 - 1;
      local_5c = -k;
      local_58 = 0;
      row_00 = 0;
      do {
        iVar8 = (int)row_00;
        iVar5 = iVar8 - k;
        if (iVar8 - k < 1) {
          iVar5 = 0;
        }
        uVar4 = k + iVar8;
        if ((int)uVar1 < k + iVar8) {
          uVar4 = uVar1;
        }
        if (iVar5 <= (int)uVar4) {
          uVar7 = 0;
          if (0 < (int)local_5c) {
            uVar7 = (ulong)local_5c;
          }
          do {
            bVar2 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                    ::k_relevant(&this->
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                 ,t1,t2,iVar8,(int)uVar7,k);
            if (bVar2) {
              iVar5 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ::e_budget(&this->
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                 ,t1,t2,iVar8,(int)uVar7,k);
              (*(this->
                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ).
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ._vptr_TEDAlgorithm[2])
                        (this,t1,t2,row_00 & 0xffffffff,uVar7 & 0xffffffff,(ulong)(uint)k,iVar5);
              pdVar6 = data_structures::Matrix<double>::at
                                 (&(this->
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).td_.super_Matrix<double>,row_00,
                                  local_58 + uVar7 +
                                  (this->
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  ).td_.band_width_);
              *pdVar6 = extraout_XMM0_Qa;
            }
            bVar2 = uVar7 < uVar4;
            uVar7 = uVar7 + 1;
          } while (bVar2);
        }
        row_00 = row_00 + 1;
        local_5c = local_5c + 1;
        local_58 = local_58 + -1;
      } while (row_00 != t1_size);
    }
    row = (long)(t1->super_Constants).tree_size_ - 1;
    pdVar6 = data_structures::Matrix<double>::at
                       (&(this->
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).td_.super_Matrix<double>,row,
                        ((long)(t2->super_Constants).tree_size_ +
                        ((this->
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).td_.band_width_ - row)) - 1);
    dVar9 = *pdVar6;
  }
  return dVar9;
}

Assistant:

double TouzetBaselineTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  
  const int t1_size = t1.tree_size_;
  const int t2_size = t2.tree_size_;

  init_matrices(t1_size, k);
  
  // Reset subproblem counter.
  subproblem_counter_ = 0;

  // If the pair of root nodes is not in k-strip (input tree size difference is
  // greater than k), return infinity.
  if (std::abs(t1_size - t2_size) > k) {
    return std::numeric_limits<double>::infinity();
  }
  
  // Nested loop over all node pairs in k-strip : |x-y|<=k. This loop iterates
  // over all node pairs from k-strip, and verifies their k-relevancy.
  for (int x = 0; x < t1_size; ++x) {
    for (int y = std::max(0, x - k); y <= std::min(x + k, t2_size-1); ++y) {
      if (k_relevant(t1, t2, x, y, k)) {
        // Compute td(x, y) with e errors - the value of e(x, y, k).
        td_.at(x, y) = tree_dist(t1, t2, x, y, k, e_budget(t1, t2, x, y, k));
      }
    }
  }
  
  return td_.at(t1.tree_size_-1, t2.tree_size_-1);
}